

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

bool __thiscall sensors_analytics::DefaultConsumer::Flush(DefaultConsumer *this)

{
  _Elt_pointer pbVar1;
  _Elt_pointer pbVar2;
  bool bVar3;
  
  LoadRecordFromDisk(this);
  do {
    pthread_mutex_lock((pthread_mutex_t *)&this->records_mutex_);
    pbVar1 = (this->records_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pbVar2 = (this->records_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->records_mutex_);
    if (pbVar2 == pbVar1) break;
    bVar3 = FlushPart(this,0x1e,false);
  } while (bVar3);
  return pbVar2 == pbVar1;
}

Assistant:

bool DefaultConsumer::Flush() {
  LoadRecordFromDisk();
  while (true) {
    {
      LockGuard records_lock(&records_mutex_);
      if (records_.empty()) {
        break;
      }
    }

    bool flush_result = FlushPart(kFlushAllBatchSize, false);
    if (!flush_result) {
      return false;
    }
  }
  return true;
}